

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void CPP::WriteInitialization::addQtFlagsInitializer
               (Item *item,DomPropertyMap *properties,QString *name,int column)

{
  DomProperty *pDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QStringBuilder<QString_&,_QString_&> local_98;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = QHash<QString,_DomProperty_*>::value(properties,name);
  if (pDVar1 != (DomProperty *)0x0) {
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_70.d = (Data *)CONCAT62(local_70.d._2_6_,0x7c);
    local_70.ptr = (char16_t *)language::qtQualifier;
    QStringBuilder<char16_t,_QString_&>::convertTo<QString>
              ((QString *)&local_58,(QStringBuilder<char16_t,_QString_&> *)&local_70);
    local_70.d = (pDVar1->m_set).d.d;
    local_70.ptr = (pDVar1->m_set).d.ptr;
    local_70.size = (pDVar1->m_set).d.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_70.size != 0) {
      QString::replace((QChar)(char16_t)&local_70,(QString *)0x7c,(CaseSensitivity)&local_58);
      local_98.a = (QString *)language::qtQualifier;
      local_98.b = (QString *)&local_70;
      QStringBuilder<QString_&,_QString_&>::convertTo<QString>((QString *)&local_88,&local_98);
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char16_t *)0x0;
      local_b8.size = 0;
      addInitializer(item,name,column,(QString *)&local_88,(QString *)&local_b8,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addQtFlagsInitializer(Item *item, const DomPropertyMap &properties,
                                                const QString &name, int column)
{
    if (const DomProperty *p = properties.value(name)) {
        const QString orOperator = u'|' + language::qtQualifier;
        QString v = p->elementSet();
        if (!v.isEmpty()) {
            v.replace(u'|', orOperator);
            addInitializer(item, name, column, language::qtQualifier + v);
        }
    }
}